

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

size_t adios2::helper::GetTotalSize(Dims *dimensions,size_t elementSize)

{
  pointer puVar1;
  
  for (puVar1 = (dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (dimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    elementSize = elementSize * *puVar1;
  }
  return elementSize;
}

Assistant:

size_t GetTotalSize(const Dims &dimensions, const size_t elementSize) noexcept
{
    return std::accumulate(dimensions.begin(), dimensions.end(), elementSize,
                           std::multiplies<size_t>());
}